

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O2

void __thiscall i2p_tests::listen_ok_accept_fail::test_method(listen_ok_accept_fail *this)

{
  long lVar1;
  string message;
  string message_00;
  string message_01;
  string message_02;
  MatchFn match;
  MatchFn match_00;
  MatchFn match_01;
  MatchFn match_02;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  char *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  undefined1 *in_stack_fffffffffffffa60;
  undefined1 *in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  _Manager_type in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  char *local_570;
  char *local_568;
  lazy_ostream local_560;
  undefined1 *local_550;
  char **local_548;
  assertion_result local_540;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  _Any_data local_508;
  code *local_4f8;
  code *local_4f0;
  _Any_data local_4e8;
  code *local_4d8;
  code *local_4d0;
  _Any_data local_4c8;
  code *local_4b8;
  code *local_4b0;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  size_t num_sockets;
  _Any_data __tmp;
  string local_468 [32];
  DebugLogHelper debugloghelper25;
  string local_3f8 [32];
  DebugLogHelper debugloghelper24;
  string local_388 [32];
  DebugLogHelper debugloghelper23;
  string local_318 [32];
  DebugLogHelper debugloghelper22;
  Connection conn;
  path local_250;
  Session session;
  Proxy sam_proxy;
  CService addr;
  CThreadInterrupt interrupt;
  
  session.m_private_key_file.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)CreateSock.super__Function_base._M_manager;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  num_sockets = 0;
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._0_7_ =
       (undefined7)CreateSock.super__Function_base._M_functor._M_unused._M_member_pointer;
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._7_1_ =
       (undefined1)((ulong)CreateSock.super__Function_base._M_functor._0_8_ >> 0x38);
  session.m_private_key_file.super_path._M_pathname._M_string_length._0_7_ =
       (undefined7)CreateSock.super__Function_base._M_functor._8_8_;
  session.m_private_key_file.super_path._M_pathname._M_string_length._7_1_ =
       (undefined1)((ulong)CreateSock.super__Function_base._M_functor._8_8_ >> 0x38);
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:71:18)>
       ::_M_manager;
  session.m_private_key_file.super_path._M_pathname.field_2._8_8_ = CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:71:18)>
       ::_M_invoke;
  CreateSock.super__Function_base._M_functor._M_unused._M_object = &num_sockets;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  std::_Function_base::~_Function_base((_Function_base *)&session);
  CThreadInterrupt::CThreadInterrupt(&interrupt);
  session.m_private_key_file.super_path._M_pathname._M_string_length._0_7_ = 0;
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._0_7_ = 0;
  session.m_private_key_file.super_path._M_pathname._M_dataplus._M_p._7_1_ = 0;
  session.m_private_key_file.super_path._M_pathname._M_string_length._7_1_ = 1;
  CService::CService(&addr,(in6_addr *)&session,0x1de8);
  Proxy::Proxy(&sam_proxy,&addr,false);
  ArgsManager::GetDataDirNet((path *)&local_250,&gArgs);
  fs::operator/((path *)&conn,(path *)&local_250,"test_i2p_private_key");
  i2p::sam::Session::Session(&session,(path *)&conn,&sam_proxy,&interrupt);
  std::filesystem::__cxx11::path::~path((path *)&conn);
  std::filesystem::__cxx11::path::~path(&local_250);
  i2p::Connection::Connection(&conn);
  lVar4 = 5;
  while( true ) {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) break;
    std::__cxx11::string::string<std::allocator<char>>
              (local_318,"Creating persistent SAM session",(allocator<char> *)&debugloghelper23);
    local_4a8._M_unused._M_object = (void *)0x0;
    local_4a8._8_8_ = 0;
    local_490 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_498 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa4c;
    message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa48;
    message._M_string_length = (size_type)in_stack_fffffffffffffa50;
    message.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa58;
    message.field_2._8_8_ = in_stack_fffffffffffffa60;
    match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa70;
    match.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa68;
    match.super__Function_base._M_manager = in_stack_fffffffffffffa78;
    match._M_invoker = (_Invoker_type)in_stack_fffffffffffffa80;
    DebugLogHelper::DebugLogHelper(&debugloghelper22,message,match);
    std::_Function_base::~_Function_base((_Function_base *)&local_4a8);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::string<std::allocator<char>>
              (local_388,"Persistent SAM session",(allocator<char> *)&debugloghelper24);
    local_4c8._M_unused._M_object = (void *)0x0;
    local_4c8._8_8_ = 0;
    local_4b0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4b8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa4c;
    message_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa48;
    message_00._M_string_length = (size_type)in_stack_fffffffffffffa50;
    message_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa58;
    message_00.field_2._8_8_ = in_stack_fffffffffffffa60;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa70;
    match_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa68;
    match_00.super__Function_base._M_manager = in_stack_fffffffffffffa78;
    match_00._M_invoker = (_Invoker_type)in_stack_fffffffffffffa80;
    DebugLogHelper::DebugLogHelper(&debugloghelper23,message_00,match_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_4c8);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::string<std::allocator<char>>
              (local_3f8,"Error accepting",(allocator<char> *)&debugloghelper25);
    local_4e8._M_unused._M_object = (void *)0x0;
    local_4e8._8_8_ = 0;
    local_4d0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4d8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa4c;
    message_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa48;
    message_01._M_string_length = (size_type)in_stack_fffffffffffffa50;
    message_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa58;
    message_01.field_2._8_8_ = in_stack_fffffffffffffa60;
    match_01.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa70;
    match_01.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa68;
    match_01.super__Function_base._M_manager = in_stack_fffffffffffffa78;
    match_01._M_invoker = (_Invoker_type)in_stack_fffffffffffffa80;
    DebugLogHelper::DebugLogHelper(&debugloghelper24,message_01,match_01);
    std::_Function_base::~_Function_base((_Function_base *)&local_4e8);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_468,"Destroying SAM session",(allocator<char> *)&local_560);
    local_508._M_unused._M_object = (void *)0x0;
    local_508._8_8_ = 0;
    local_4f0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_4f8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa4c;
    message_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa48;
    message_02._M_string_length = (size_type)in_stack_fffffffffffffa50;
    message_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa58;
    message_02.field_2._8_8_ = in_stack_fffffffffffffa60;
    match_02.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffa70;
    match_02.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffa68;
    match_02.super__Function_base._M_manager = in_stack_fffffffffffffa78;
    match_02._M_invoker = (_Invoker_type)in_stack_fffffffffffffa80;
    DebugLogHelper::DebugLogHelper(&debugloghelper25,message_02,match_02);
    std::_Function_base::~_Function_base((_Function_base *)&local_508);
    std::__cxx11::string::~string(local_468);
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_510 = "";
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_520 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x80;
    file.m_begin = (iterator)&local_518;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_528,msg);
    local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)i2p::sam::Session::Listen(&session,&conn);
    local_540.m_message.px = (element_type *)0x0;
    local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_570 = "session.Listen(conn)";
    local_568 = "";
    local_560.m_empty = false;
    local_560._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_550 = boost::unit_test::lazy_ostream::inst;
    local_548 = &local_570;
    in_stack_fffffffffffffa80 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    pvVar2 = (iterator)0x2;
    pvVar3 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_540,&local_560,2,0,WARN,(check_type)in_stack_fffffffffffffa50,
               (size_t)&stack0xfffffffffffffa80,0x80);
    boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
    in_stack_fffffffffffffa70 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    in_stack_fffffffffffffa78 = (_Manager_type)0xb93be3;
    in_stack_fffffffffffffa60 = &boost::unit_test::basic_cstring<char_const>::null;
    in_stack_fffffffffffffa68 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = (iterator)0x81;
    file_00.m_begin = &stack0xfffffffffffffa70;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
               (size_t)&stack0xfffffffffffffa60,msg_00);
    bVar5 = i2p::sam::Session::Accept(&session,&conn);
    local_540.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar5;
    local_540.m_message.px = (element_type *)0x0;
    local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_570 = "!session.Accept(conn)";
    local_568 = "";
    local_560.m_empty = false;
    local_560._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_550 = boost::unit_test::lazy_ostream::inst;
    local_548 = &local_570;
    in_stack_fffffffffffffa50 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    in_stack_fffffffffffffa58 = "";
    in_stack_fffffffffffffa48 = 0;
    in_stack_fffffffffffffa4c = 0;
    in_R8 = (iterator)0x2;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_540,&local_560,2,0,WARN,0xb93b81,(size_t)&stack0xfffffffffffffa50,0x81);
    boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
    DebugLogHelper::~DebugLogHelper(&debugloghelper25);
    DebugLogHelper::~DebugLogHelper(&debugloghelper24);
    DebugLogHelper::~DebugLogHelper(&debugloghelper23);
    DebugLogHelper::~DebugLogHelper(&debugloghelper22);
  }
  i2p::Connection::~Connection(&conn);
  i2p::sam::Session::~Session(&session);
  Proxy::~Proxy(&sam_proxy);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  std::condition_variable::~condition_variable(&interrupt.cond);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(listen_ok_accept_fail)
{
    size_t num_sockets{0};
    CreateSock = [&num_sockets](int, int, int) {
        // clang-format off
        ++num_sockets;
        // First socket is the control socket for creating the session.
        if (num_sockets == 1) {
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to DEST GENERATE
                "DEST REPLY PUB=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAA== PRIV=WnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqFpxji10Qah0IXVYxZVqkcScM~Yccf9v8BnNlaZbWtSoWnGOLXRBqHQhdVjFlWqRxJwz9hxx~2~wGc2Vplta1KhacY4tdEGodCF1WMWVapHEnDP2HHH~b~AZzZWmW1rUqLE4SD-yjT48UNI7qiTUfIPiDitCoiTTz2cr4QGfw89rBQAEAAcAAOvuCIKTyv5f~1QgGq7XQl-IqBULTB5WzB3gw5yGPtd1p0AeoADrq1ccZggLPQ4ZLUsGK-HVw373rcTfvxrcuwenqVjiN4tbbYLWtP7xXGWj6fM6HyORhU63GphrjEePpMUHDHXd3o7pWGM-ieVVQSK~1MzF9P93pQWI3Do52EeNAayz4HbpPjNhVBzG1hUEFwznfPmUZBPuaOR4-uBm1NEWEuONlNOCctE4-U0Ukh94z-Qb55U5vXjR5G4apmBblr68t6Wm1TKlzpgFHzSqLryh3stWqrOKY1H0z9eZ2z1EkHFOpD5LyF6nf51e-lV7HLMl44TYzoEHK8RRVodtLcW9lacVdBpv~tOzlZERIiDziZODPETENZMz5oy9DQ7UUw==\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // Subsequent sockets are for recreating the session or for listening and accepting incoming connections.
        if (num_sockets % 2 == 0) {
            // Replies to Listen() and Accept()
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to STREAM ACCEPT
                "STREAM STATUS RESULT=OK\n"
                // continued reply to STREAM ACCEPT, violating the protocol described at
                // https://geti2p.net/en/docs/api/samv3#Accept%20Response
                // should be base64, something like
                // "IchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLiHIVetPG2g6F26s0CkqhQ5k1z1YKA2zwIWSbzUV18YuIchV608baDoXbqzQKSqFDmTXPVgoDbPAhZJvNRXXxi4hyFXrTxtoOhdurNApKoUOZNc9WCgNs8CFkm81FdfGLlSreVaCuCS5sdb-8ToWULWP7kt~lRPDeUNxQMq3cRSBBQAEAAcAAA==\n"
                "STREAM STATUS RESULT=I2P_ERROR MESSAGE=\"Session was closed\"\n"
            );
        } else {
            // Another control socket, but without creating a destination (it is cached in the session).
            return std::make_unique<StaticContentsSock>(
                // reply to HELLO
                "HELLO REPLY RESULT=OK VERSION=3.1\n"
                // reply to SESSION CREATE
                "SESSION STATUS RESULT=OK\n"
                // dummy to avoid reporting EOF on the socket
                "a"
            );
        }
        // clang-format on
    };

    CThreadInterrupt interrupt;
    const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
    const Proxy sam_proxy(addr, false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key",
                              sam_proxy,
                              &interrupt);

    i2p::Connection conn;
    for (size_t i = 0; i < 5; ++i) {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("Persistent SAM session" /* ... created */);
        ASSERT_DEBUG_LOG("Error accepting");
        ASSERT_DEBUG_LOG("Destroying SAM session");
        BOOST_REQUIRE(session.Listen(conn));
        BOOST_REQUIRE(!session.Accept(conn));
    }
}